

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O1

void __thiscall QGraphicsViewPrivate::_q_unsetViewportCursor(QGraphicsViewPrivate *this)

{
  QGraphicsView *this_00;
  QGraphicsItem *this_01;
  QWidget *this_02;
  undefined1 *puVar1;
  bool bVar2;
  undefined4 uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  undefined1 auVar9 [16];
  double extraout_XMM1_Qa;
  undefined1 auVar10 [16];
  undefined1 local_50 [16];
  undefined1 *puStack_40;
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsView **)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_50._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  uVar3 = QEventPoint::position();
  auVar10._0_8_ =
       (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
       extraout_XMM1_Qa;
  auVar10._8_8_ =
       (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
       extraout_XMM0_Qa;
  auVar10 = minpd(_DAT_0066f5d0,auVar10);
  auVar9._8_8_ = -(ulong)(-2147483648.0 < auVar10._8_8_);
  auVar9._0_8_ = -(ulong)(-2147483648.0 < auVar10._0_8_);
  uVar4 = movmskpd(uVar3,auVar9);
  uVar6 = 0x8000000000000000;
  if ((uVar4 & 1) != 0) {
    uVar6 = (ulong)(uint)(int)auVar10._0_8_ << 0x20;
  }
  uVar5 = 0x80000000;
  if ((uVar4 & 2) != 0) {
    uVar5 = (ulong)(uint)(int)auVar10._8_8_;
  }
  local_50._0_8_ = uVar5 | uVar6;
  QGraphicsView::items((QList<QGraphicsItem_*> *)(local_50 + 8),this_00,(QPoint *)local_50);
  puVar1 = puStack_40;
  if (local_38 != (undefined1 *)0x0) {
    lVar8 = (long)local_38 << 3;
    lVar7 = 0;
    do {
      this_01 = *(QGraphicsItem **)(puVar1 + lVar7);
      bVar2 = QGraphicsItem::isEnabled(this_01);
      if (bVar2) {
        bVar2 = QGraphicsItem::hasCursor(this_01);
        if (bVar2) {
          QGraphicsItem::cursor((QGraphicsItem *)local_50);
          _q_setViewportCursor(this,(QCursor *)local_50);
          goto LAB_0063d796;
        }
      }
      lVar7 = lVar7 + 8;
    } while (lVar8 != lVar7);
  }
  if (this->hasStoredOriginalCursor == true) {
    this->hasStoredOriginalCursor = false;
    this_02 = (this->super_QAbstractScrollAreaPrivate).viewport;
    if (this->dragMode == ScrollHandDrag) {
      QCursor::QCursor((QCursor *)local_50,OpenHandCursor);
      QWidget::setCursor(this_02,(QCursor *)local_50);
LAB_0063d796:
      QCursor::~QCursor((QCursor *)local_50);
    }
    else {
      QWidget::setCursor(this_02,&this->originalCursor);
    }
  }
  if ((QGraphicsItemPrivate *)local_50._8_8_ != (QGraphicsItemPrivate *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_50._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_50._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_50._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_50._8_8_,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsViewPrivate::_q_unsetViewportCursor()
{
    Q_Q(QGraphicsView);
    const auto items = q->items(lastMouseEvent->position().toPoint());
    for (QGraphicsItem *item : items) {
        if (item->isEnabled() && item->hasCursor()) {
            _q_setViewportCursor(item->cursor());
            return;
        }
    }

    // Restore the original viewport cursor.
    if (hasStoredOriginalCursor) {
        hasStoredOriginalCursor = false;
        if (dragMode == QGraphicsView::ScrollHandDrag)
            viewport->setCursor(Qt::OpenHandCursor);
        else
            viewport->setCursor(originalCursor);
    }
}